

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O2

uint16_t nni_url_default_port(char *scheme)

{
  char cVar1;
  char *__s;
  int iVar2;
  size_t __n;
  long lVar3;
  
  lVar3 = 8;
  do {
    if (lVar3 == 200) {
      return 0;
    }
    __s = *(char **)(sock_stats_init_rx_bytes_info + lVar3 + 0x18);
    __n = strlen(__s);
    iVar2 = strncmp(__s,scheme,__n);
    if (iVar2 == 0) {
      cVar1 = scheme[__n];
      if ((cVar1 == '4') || (cVar1 == '6')) {
        cVar1 = scheme[__n + 1];
      }
      if (cVar1 == '\0') {
        return *(uint16_t *)((long)&nni_url_default_ports[0].scheme + lVar3);
      }
    }
    lVar3 = lVar3 + 0x10;
  } while( true );
}

Assistant:

uint16_t
nni_url_default_port(const char *scheme)
{
	const char *s;

	for (int i = 0; (s = nni_url_default_ports[i].scheme) != NULL; i++) {
		size_t l = strlen(s);
		if (strncmp(s, scheme, strlen(s)) != 0) {
			continue;
		}
		// It can have a suffix of either "4" or "6" to restrict
		// the address family.  This is an NNG extension.
		switch (scheme[l]) {
		case '\0':
			return (nni_url_default_ports[i].port);
		case '4':
		case '6':
			if (scheme[l + 1] == '\0') {
				return (nni_url_default_ports[i].port);
			}
			break;
		}
	}
	return (0);
}